

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_cursor.hpp
# Opt level: O2

void __thiscall
jsoncons::cbor::basic_cbor_cursor<jsoncons::stream_source<unsigned_char>,std::allocator<char>>::
reset<std::__cxx11::istringstream&>
          (basic_cbor_cursor<jsoncons::stream_source<unsigned_char>,std::allocator<char>> *this,
          basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_> *source)

{
  char cVar1;
  
  basic_cbor_parser<jsoncons::stream_source<unsigned_char>,std::allocator<char>>::
  reset<std::__cxx11::istringstream&>
            ((basic_cbor_parser<jsoncons::stream_source<unsigned_char>,std::allocator<char>> *)
             (this + 8),source);
  basic_staj_visitor<char>::reset((basic_staj_visitor<char> *)(this + 0x280));
  basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::reset
            ((basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_> *)(this + 0x2e0)
            );
  this[0x3b0] = (basic_cbor_cursor<jsoncons::stream_source<unsigned_char>,std::allocator<char>>)0x0;
  cVar1 = (**(code **)(*(long *)this + 0x18))(this);
  if (cVar1 != '\0') {
    return;
  }
  (**(code **)(*(long *)this + 0x38))(this);
  return;
}

Assistant:

void reset(Sourceable&& source)
    {
        parser_.reset(std::forward<Sourceable>(source));
        cursor_visitor_.reset();
        cursor_handler_adaptor_.reset();
        eof_ = false;
        if (!done())
        {
            next();
        }
    }